

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThreads.cpp
# Opt level: O3

Value __thiscall xmrig::OclThreads::toJSON(OclThreads *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *pDVar1;
  long in_RDX;
  long extraout_RDX;
  OclThread *thread;
  Document *doc_00;
  Value VVar2;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined2 *)
   ((long)&(this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
           _M_impl.super__Vector_impl_data._M_finish + 6) = 4;
  doc_00 = *(Document **)
            &(doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ).data_;
  pDVar1 = (Document *)
           (doc->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  if (doc_00 != pDVar1) {
    do {
      OclThread::toJSON((OclThread *)&stack0xffffffffffffffc0,doc_00);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&stack0xffffffffffffffc0,allocator);
      doc_00 = (Document *)&(doc_00->stack_).initialCapacity_;
      in_RDX = extraout_RDX;
    } while (doc_00 != pDVar1);
  }
  VVar2.data_.o.members = (Member *)in_RDX;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::OclThreads::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);

    out.SetArray();

    for (const OclThread &thread : m_data) {
        out.PushBack(thread.toJSON(doc), allocator);
    }

    return out;
}